

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

mg_connection * mg_create_connection(mg_mgr *mgr,mg_event_handler_t callback,mg_add_sock_opts opts)

{
  mg_connection *pmVar1;
  double dVar2;
  
  pmVar1 = (mg_connection *)calloc(1,0xd0);
  if (pmVar1 == (mg_connection *)0x0) {
    if (opts.error_string != (char **)0x0) {
      *opts.error_string = "failed create connection";
    }
    pmVar1 = (mg_connection *)0x0;
  }
  else {
    pmVar1->sock = -1;
    pmVar1->handler = callback;
    pmVar1->mgr = mgr;
    dVar2 = cs_time();
    pmVar1->last_io_time = (long)dVar2;
    pmVar1->flags = (ulong)(opts.flags & 0x3f01000);
    pmVar1->user_data = opts.user_data;
    pmVar1->recv_mbuf_limit = 0xffffffffffffffff;
  }
  return pmVar1;
}

Assistant:

mg_connection *mg_create_connection(
        struct mg_mgr *mgr, mg_event_handler_t callback,
        struct mg_add_sock_opts opts) {
    struct mg_connection *conn;

    if ((conn = (struct mg_connection *) MG_CALLOC(1, sizeof(*conn))) != NULL) {
        conn->sock = INVALID_SOCKET;
        conn->handler = callback;
        conn->mgr = mgr;
        conn->last_io_time = mg_time();
        conn->flags = opts.flags & _MG_ALLOWED_CONNECT_FLAGS_MASK;
        conn->user_data = opts.user_data;
        /*
     * SIZE_MAX is defined as a long long constant in
     * system headers on some platforms and so it
     * doesn't compile with pedantic ansi flags.
     */
        conn->recv_mbuf_limit = ~0;
        if (!mg_if_create_conn(conn)) {
            MG_FREE(conn);
            conn = NULL;
            MG_SET_PTRPTR(opts.error_string, "failed init connection");
        }
    } else {
        MG_SET_PTRPTR(opts.error_string, "failed create connection");
    }

    return conn;
}